

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::multiset<unsigned_char,std::less<unsigned_char>,std::allocator<unsigned_char>>,void>
               (multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                *container,ostream *os)

{
  bool bVar1;
  reference value;
  uchar *elem;
  iterator __end0;
  iterator __begin0;
  multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *container_local
  ;
  
  std::operator<<(os,'{');
  __range3 = (multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             0x0;
  __end0 = std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
           begin(container);
  elem = (uchar *)std::
                  multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                  ::end(container);
  do {
    bVar1 = std::operator==(&__end0,(_Self *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_002d0f77:
      if (__range3 !=
          (multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)0x0)
      {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = std::_Rb_tree_const_iterator<unsigned_char>::operator*(&__end0);
    if ((__range3 !=
         (multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)0x0)
       && (std::operator<<(os,','),
          __range3 ==
          (multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)0x20)
       ) {
      std::operator<<(os," ...");
      goto LAB_002d0f77;
    }
    std::operator<<(os,' ');
    UniversalPrint<unsigned_char>(value,os);
    __range3 = (multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
               &(__range3->_M_t)._M_impl.field_0x1;
    std::_Rb_tree_const_iterator<unsigned_char>::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }